

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

void __thiscall
helics::CloneOperator::CloneOperator
          (CloneOperator *this,
          function<std::vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>_(const_helics::Message_*)>
          *userCloneFunction)

{
  undefined8 uVar1;
  
  (this->super_FilterOperator)._vptr_FilterOperator = (_func_int **)&PTR__CloneOperator_0055a170;
  *(undefined8 *)&(this->evalFunction).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->evalFunction).super__Function_base._M_functor + 8) = 0;
  (this->evalFunction).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->evalFunction)._M_invoker = userCloneFunction->_M_invoker;
  if ((userCloneFunction->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(userCloneFunction->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->evalFunction).super__Function_base._M_functor =
         *(undefined8 *)&(userCloneFunction->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->evalFunction).super__Function_base._M_functor + 8) = uVar1;
    (this->evalFunction).super__Function_base._M_manager =
         (userCloneFunction->super__Function_base)._M_manager;
    (userCloneFunction->super__Function_base)._M_manager = (_Manager_type)0x0;
    userCloneFunction->_M_invoker = (_Invoker_type)0x0;
  }
  return;
}

Assistant:

CloneOperator::CloneOperator(
    std::function<std::vector<std::unique_ptr<Message>>(const Message*)> userCloneFunction):
    evalFunction(std::move(userCloneFunction))
{
}